

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_gameboard.cpp
# Opt level: O1

void Field::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 local_20;
  undefined4 local_1c;
  void *local_18;
  undefined4 *local_10;
  undefined4 *local_8;
  
  if (_c == IndexOfMethod) {
    if ((*_a[1] == fieldClicked) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      return;
    }
  }
  else if ((_c == InvokeMetaMethod) && (_id == 0)) {
    local_1c = *_a[1];
    local_20 = *_a[2];
    local_10 = &local_1c;
    local_8 = &local_20;
    local_18 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,0,&local_18);
    return;
  }
  return;
}

Assistant:

void Field::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<Field *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->fieldClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (Field::*)(int , int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Field::fieldClicked)) {
                *result = 0;
                return;
            }
        }
    }
}